

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O1

bool __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>
::CheckDomainReturnFalseIfTrivial
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>
           *this,PLPoints *result)

{
  double dVar1;
  void *pvVar2;
  int iVar3;
  Error *this_00;
  undefined4 extraout_var;
  double *in_R9;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> local_f8;
  vector<double,_std::allocator<double>_> local_d8;
  double local_b8;
  double local_b0;
  char *local_a8;
  undefined8 local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined4 uStack_78;
  undefined4 uStack_74;
  pointer local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  double local_28;
  
  local_b0 = this->lbx_;
  dVar1 = this->ubx_;
  if (dVar1 + 1e-06 < local_b0) {
    this_00 = (Error *)__cxa_allocate_exception(0x18);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Model infeasible: ","");
    iVar3 = (*this->_vptr_BasicPLApproximator[2])(this);
    local_a0 = CONCAT44(extraout_var,iVar3);
    local_a8 = (char *)this->lbx_;
    local_28 = this->ubx_;
    fmt::format<char_const*,double,double>
              (&local_48,(fmt *)"PLApprox {}: empty argument domain [{}, {}]",(CStringRef)&local_a0,
               &local_a8,&local_28,in_R9);
    std::operator+(&local_98,&local_68,&local_48);
    Error::Error(this_00,(CStringRef)local_98._M_dataplus._M_p,200);
    __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
  }
  local_b8 = dVar1 + -1e-06;
  if (local_b8 < local_b0) {
    local_68._M_dataplus._M_p = (pointer)((dVar1 + local_b0) * 0.5);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_68;
    std::vector<double,_std::allocator<double>_>::vector(&local_f8,__l,(allocator_type *)&local_a0);
    (*this->_vptr_BasicPLApproximator[9])((this->lbx_ + this->ubx_) * 0.5,this);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_48;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_d8,__l_00,(allocator_type *)&local_a8);
    local_98._M_dataplus._M_p =
         (pointer)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_98._M_string_length =
         (size_type)
         local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_98.field_2._M_allocated_capacity =
         (size_type)
         local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.field_2._8_4_ =
         local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_;
    local_98.field_2._12_4_ =
         local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._4_4_;
    uStack_78 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish._0_4_;
    uStack_74 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_;
    local_70 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&result->x_,&local_98);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (&result->y_,(undefined1 *)((long)&local_98.field_2 + 8));
    pvVar2 = (void *)CONCAT44(local_98.field_2._12_4_,local_98.field_2._8_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_70 - (long)pvVar2);
    }
    if ((pointer)local_98._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_98._M_dataplus._M_p,
                      local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
    }
    if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return local_b0 <= local_b8;
}

Assistant:

bool BasicPLApproximator<FuncCon>::CheckDomainReturnFalseIfTrivial(
    PLPoints& result) {
  if (lbx() > ubx()+1e-6)
    MP_INFEAS(fmt::format("PLApprox {}: "
                          "empty argument domain [{}, {}]",
                          GetConTypeName(), lbx(), ubx()));
  /// Domain ~ single point
  if (lbx() > ubx()-1e-6) {
    result = { {(lbx()+ubx())/2.0}, {eval((lbx()+ubx())/2.0)} };
    return false;
  }
  return true;
}